

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

uint16_t icu_63::getName(UCharNames *names,uint32_t code,UCharNameChoice nameChoice,char *buffer,
                        uint16_t bufferLength)

{
  uint16_t uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  ulong uVar4;
  uint16_t lengths [34];
  uint16_t offsets [34];
  uint16_t auStack_c8 [40];
  uint16_t local_78 [40];
  
  puVar2 = getGroup(names,code);
  if (*puVar2 == (uint16_t)(code >> 5)) {
    puVar3 = expandGroupLengths((uint8_t *)
                                ((long)&names->tokenStringOffset +
                                ((long)(int)((uint)puVar2[1] << 0x10) | (ulong)puVar2[2]) +
                                (ulong)names->groupStringOffset),local_78,auStack_c8);
    uVar4 = (ulong)((code & 0x1f) * 2);
    uVar1 = expandName(names,puVar3 + *(ushort *)((long)local_78 + uVar4),
                       *(uint16_t *)((long)auStack_c8 + uVar4),nameChoice,buffer,bufferLength);
    return uVar1;
  }
  if (bufferLength != 0) {
    *buffer = '\0';
  }
  return 0;
}

Assistant:

static uint16_t
getName(UCharNames *names, uint32_t code, UCharNameChoice nameChoice,
        char *buffer, uint16_t bufferLength) {
    const uint16_t *group=getGroup(names, code);
    if((uint16_t)(code>>GROUP_SHIFT)==group[GROUP_MSB]) {
        return expandGroupName(names, group, (uint16_t)(code&GROUP_MASK), nameChoice,
                               buffer, bufferLength);
    } else {
        /* group not found */
        /* zero-terminate */
        if(bufferLength>0) {
            *buffer=0;
        }
        return 0;
    }
}